

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamAlignment.cpp
# Opt level: O0

void __thiscall BamTools::BamAlignment::BamAlignment(BamAlignment *this,BamAlignment *other)

{
  string *in_RSI;
  string *in_RDI;
  BamAlignmentSupportData *this_00;
  BamAlignmentSupportData *in_stack_ffffffffffffff98;
  vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *in_stack_ffffffffffffffe8;
  
  std::__cxx11::string::string(in_RDI,in_RSI);
  *(undefined4 *)(in_RDI + 0x20) = *(undefined4 *)(in_RSI + 0x20);
  std::__cxx11::string::string(in_RDI + 0x28,in_RSI + 0x28);
  std::__cxx11::string::string(in_RDI + 0x48,in_RSI + 0x48);
  std::__cxx11::string::string(in_RDI + 0x68,in_RSI + 0x68);
  std::__cxx11::string::string(in_RDI + 0x88,in_RSI + 0x88);
  *(undefined4 *)(in_RDI + 0xa8) = *(undefined4 *)(in_RSI + 0xa8);
  *(undefined4 *)(in_RDI + 0xac) = *(undefined4 *)(in_RSI + 0xac);
  *(undefined2 *)(in_RDI + 0xb0) = *(undefined2 *)(in_RSI + 0xb0);
  *(undefined2 *)(in_RDI + 0xb2) = *(undefined2 *)(in_RSI + 0xb2);
  *(undefined4 *)(in_RDI + 0xb4) = *(undefined4 *)(in_RSI + 0xb4);
  std::vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>::vector
            ((vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *)in_RSI,
             in_stack_ffffffffffffffe8);
  *(undefined4 *)(in_RDI + 0xd0) = *(undefined4 *)(in_RSI + 0xd0);
  *(undefined4 *)(in_RDI + 0xd4) = *(undefined4 *)(in_RSI + 0xd4);
  *(undefined4 *)(in_RDI + 0xd8) = *(undefined4 *)(in_RSI + 0xd8);
  this_00 = (BamAlignmentSupportData *)(in_RDI + 0xe0);
  std::__cxx11::string::string((string *)this_00,in_RSI + 0xe0);
  BamAlignmentSupportData::BamAlignmentSupportData(this_00,in_stack_ffffffffffffff98);
  std::__cxx11::string::string(in_RDI + 0x138);
  return;
}

Assistant:

BamAlignment::BamAlignment(const BamAlignment& other)
    : Name(other.Name)
    , Length(other.Length)
    , QueryBases(other.QueryBases)
    , AlignedBases(other.AlignedBases)
    , Qualities(other.Qualities)
    , TagData(other.TagData)
    , RefID(other.RefID)
    , Position(other.Position)
    , Bin(other.Bin)
    , MapQuality(other.MapQuality)
    , AlignmentFlag(other.AlignmentFlag)
    , CigarData(other.CigarData)
    , MateRefID(other.MateRefID)
    , MatePosition(other.MatePosition)
    , InsertSize(other.InsertSize)
    , Filename(other.Filename)
    , SupportData(other.SupportData)
{ }